

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O0

void init_objects(void)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  uint local_18;
  int iStack_14;
  char oclass;
  int sum;
  int last;
  int first;
  int i;
  
  for (last = 0; last < 0x12; last = last + 1) {
    bases[last] = 0;
  }
  for (last = 0; last < 0x21a; last = last + 1) {
    objects[last].oc_descr_idx = (short)last;
    objects[last].oc_name_idx = (short)last;
  }
  sum = 0;
  while (sum < 0x21a) {
    cVar1 = objects[sum].oc_class;
    iStack_14 = sum;
    do {
      iStack_14 = iStack_14 + 1;
      bVar3 = false;
      if (iStack_14 < 0x21a) {
        bVar3 = objects[iStack_14].oc_class == cVar1;
      }
    } while (bVar3);
    bases[(int)cVar1] = sum;
    if (cVar1 == '\r') {
      setgemprobs((d_level *)0x0);
      iVar2 = rn2(2);
      if (iVar2 != 0) {
        objects[0x1f7].oc_descr_idx = objects[500].oc_descr_idx;
        objects[0x1f7].oc_color = objects[500].oc_color;
      }
      iVar2 = rn2(2);
      if (iVar2 != 0) {
        objects[0x1f9].oc_descr_idx = objects[500].oc_descr_idx;
        objects[0x1f9].oc_color = objects[500].oc_color;
      }
      iVar2 = rn2(4);
      switch(iVar2) {
      case 0:
        break;
      case 1:
        objects[0x202].oc_descr_idx = objects[500].oc_descr_idx;
        objects[0x202].oc_color = objects[500].oc_color;
        break;
      case 2:
        objects[0x202].oc_descr_idx = objects[0x1f1].oc_descr_idx;
        objects[0x202].oc_color = objects[0x1f1].oc_color;
        break;
      case 3:
        objects[0x202].oc_descr_idx = objects[0x1f6].oc_descr_idx;
        objects[0x202].oc_color = objects[0x1f6].oc_color;
      }
    }
    while( true ) {
      local_18 = 0;
      for (last = sum; last < iStack_14; last = last + 1) {
        local_18 = (int)objects[last].oc_prob + local_18;
      }
      if (local_18 != 0) break;
      for (last = sum; last < iStack_14; last = last + 1) {
        objects[last].oc_prob = (short)(((last + 1000) - sum) / (iStack_14 - sum));
      }
    }
    if (local_18 != 1000) {
      raw_printf("init-prob error for class %d (%d%%)\n",(ulong)(uint)(int)cVar1,(ulong)local_18);
    }
    sum = iStack_14;
  }
  shuffle_all();
  return;
}

Assistant:

void init_objects(void)
{
	int i, first, last, sum;
	char oclass;

	/* bug fix to prevent "initialization error" abort on Intel Xenix.
	 * reported by mikew@semike
	 */
	for (i = 0; i < MAXOCLASSES; i++)
		bases[i] = 0;
	/* initialize object descriptions */
	for (i = 0; i < NUM_OBJECTS; i++)
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;
	/* init base; if probs given check that they add up to 1000,
	   otherwise compute probs */
	first = 0;
	while ( first < NUM_OBJECTS ) {
		oclass = objects[first].oc_class;
		last = first+1;
		while (last < NUM_OBJECTS && objects[last].oc_class == oclass) last++;
		bases[(int)oclass] = first;

		if (oclass == GEM_CLASS) {
			setgemprobs(NULL);

			if (rn2(2)) { /* change turquoise from green to blue? */
			    COPY_OBJ_DESCR(objects[TURQUOISE],objects[SAPPHIRE]);
			}
			if (rn2(2)) { /* change aquamarine from green to blue? */
			    COPY_OBJ_DESCR(objects[AQUAMARINE],objects[SAPPHIRE]);
			}
			switch (rn2(4)) { /* change fluorite from violet? */
			    case 0:  break;
			    case 1:	/* blue */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[SAPPHIRE]);
				break;
			    case 2:	/* white */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[DIAMOND]);
				break;
			    case 3:	/* green */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[EMERALD]);
				break;
			}
		}
	check:
		sum = 0;
		for (i = first; i < last; i++) sum += objects[i].oc_prob;
		if (sum == 0) {
			for (i = first; i < last; i++)
			    objects[i].oc_prob = (1000+i-first)/(last-first);
			goto check;
		}
		if (sum != 1000)
			raw_printf("init-prob error for class %d (%d%%)\n", oclass, sum);
		
		first = last;
	}
	/* shuffle descriptions */
	shuffle_all();
}